

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_binning_array_unaligned.h
# Opt level: O2

Split * __thiscall
embree::sse2::UnalignedHeuristicArrayBinningSAH<embree::PrimRef,_32UL>::find_template<false>
          (Split *__return_storage_ptr__,
          UnalignedHeuristicArrayBinningSAH<embree::PrimRef,_32UL> *this,PrimInfoRange *set,
          size_t logBlockSize,LinearSpace3fa *space)

{
  BBox3fa *pBVar1;
  int *piVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  Scene *pSVar5;
  Geometry *pGVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 uVar10;
  undefined8 uVar11;
  long lVar12;
  ulong uVar13;
  undefined1 (*pauVar14) [16];
  undefined8 *puVar15;
  ulong uVar16;
  uint uVar17;
  float *pfVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  float fVar22;
  int iVar23;
  int iVar27;
  int iVar28;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int iVar29;
  uint uVar30;
  undefined1 auVar31 [16];
  float fVar32;
  float fVar36;
  float fVar38;
  undefined1 auVar34 [16];
  uint uVar33;
  uint uVar37;
  uint uVar39;
  float fVar40;
  undefined1 auVar35 [16];
  uint uVar41;
  uint uVar42;
  uint uVar43;
  undefined1 auVar44 [16];
  float fVar46;
  undefined1 auVar45 [16];
  float fVar47;
  float fVar48;
  float fVar50;
  undefined1 auVar49 [16];
  undefined1 auVar51 [16];
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  float fVar56;
  float fVar57;
  BinBoundsAndCenter binBoundsAndCenter;
  BBox3fa bounds;
  Binner binner;
  vuint4 rCounts [32];
  undefined8 local_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 local_1310;
  undefined8 uStack_1308;
  undefined1 local_1300 [16];
  float local_12f0;
  float fStack_12ec;
  float fStack_12e8;
  float fStack_12e4;
  float local_12e0;
  float fStack_12dc;
  float fStack_12d8;
  float fStack_12d4;
  uint local_12d0 [4];
  undefined1 local_12c0 [16];
  ulong local_12b0;
  float local_1290 [7];
  float fStack_1274;
  float local_1270 [104];
  undefined1 auStack_10d0 [16];
  undefined1 auStack_10c0 [16];
  undefined1 auStack_10b0 [16];
  undefined1 auStack_10a0 [16];
  undefined1 auStack_1090 [16];
  undefined1 local_1080 [16];
  undefined1 local_1070 [16];
  undefined1 local_1060 [16];
  undefined1 local_1050 [16];
  undefined1 local_1040 [16];
  undefined1 local_1030 [2976];
  int aiStack_490 [4];
  undefined8 local_480;
  int aiStack_478 [122];
  int aiStack_290 [8];
  int aiStack_270 [144];
  
  puVar15 = &local_480;
  for (lVar12 = 0x50; lVar12 != 0xc50; lVar12 = lVar12 + 0x60) {
    *(undefined1 (*) [16])(auStack_1090 + lVar12) = _DAT_01f45a30;
    *(undefined1 (*) [16])(local_1080 + lVar12) = _DAT_01f45a40;
    *(undefined1 (*) [16])(auStack_10b0 + lVar12) = _DAT_01f45a30;
    *(undefined1 (*) [16])(auStack_10a0 + lVar12) = _DAT_01f45a40;
    *(undefined1 (*) [16])(auStack_10d0 + lVar12) = _DAT_01f45a30;
    *(undefined1 (*) [16])(auStack_10c0 + lVar12) = _DAT_01f45a40;
    *puVar15 = 0;
    puVar15[1] = 0;
    puVar15 = puVar15 + 2;
  }
  uVar3 = (set->super_range<unsigned_long>)._begin;
  uVar4 = (set->super_range<unsigned_long>)._end;
  fVar22 = (float)(uVar4 - uVar3) * 0.05 + 4.0;
  uVar16 = (ulong)fVar22;
  uVar16 = (long)(fVar22 - 9.223372e+18) & (long)uVar16 >> 0x3f | uVar16;
  uVar20 = 0x20;
  if (uVar16 < 0x20) {
    uVar20 = uVar16;
  }
  pBVar1 = &(set->super_CentGeomBBox3fa).centBounds;
  fVar22 = (pBVar1->lower).field_0.m128[0];
  fVar46 = (set->super_CentGeomBBox3fa).centBounds.lower.field_0.m128[1];
  uVar10 = *(undefined8 *)&(pBVar1->lower).field_0;
  pfVar18 = (set->super_CentGeomBBox3fa).centBounds.lower.field_0.m128 + 2;
  fVar47 = *pfVar18;
  fVar48 = (set->super_CentGeomBBox3fa).centBounds.lower.field_0.m128[3];
  uVar11 = *(undefined8 *)pfVar18;
  auVar24._0_4_ = (set->super_CentGeomBBox3fa).centBounds.upper.field_0.m128[0] - fVar22;
  auVar24._4_4_ = (set->super_CentGeomBBox3fa).centBounds.upper.field_0.m128[1] - fVar46;
  auVar24._8_4_ = (set->super_CentGeomBBox3fa).centBounds.upper.field_0.m128[2] - fVar47;
  auVar24._12_4_ = (set->super_CentGeomBBox3fa).centBounds.upper.field_0.m128[3] - fVar48;
  auVar34 = maxps(_DAT_01f46b30,auVar24);
  auVar35._0_4_ = (float)(long)uVar20 * 0.99;
  auVar35._4_4_ = auVar35._0_4_;
  auVar35._8_4_ = auVar35._0_4_;
  auVar35._12_4_ = auVar35._0_4_;
  auVar24 = divps(auVar35,auVar34);
  fVar32 = (float)(-(uint)((float)DAT_01f46b30 < auVar34._0_4_) & auVar24._0_4_);
  fVar36 = (float)(-(uint)(DAT_01f46b30._4_4_ < auVar34._4_4_) & auVar24._4_4_);
  fVar38 = (float)(-(uint)(DAT_01f46b30._8_4_ < auVar34._8_4_) & auVar24._8_4_);
  fVar40 = (float)(-(uint)(DAT_01f46b30._12_4_ < auVar34._12_4_) & auVar24._12_4_);
  local_1290[0] = fVar32;
  local_1290[1] = fVar36;
  local_1290[2] = fVar38;
  pSVar5 = this->scene;
  local_1330 = *(undefined8 *)&(space->vx).field_0;
  uStack_1328 = *(undefined8 *)((long)&(space->vx).field_0 + 8);
  local_1320 = *(undefined8 *)&(space->vy).field_0;
  uStack_1318 = *(undefined8 *)((long)&(space->vy).field_0 + 8);
  local_1310 = *(undefined8 *)&(space->vz).field_0;
  uStack_1308 = *(undefined8 *)((long)&(space->vz).field_0 + 8);
  uVar16 = uVar4 - uVar3;
  if (uVar16 != 0) {
    uVar17 = (int)uVar20 - 1;
    pfVar18 = this->prims[uVar3].lower.field_0.m128 + 3;
    local_12b0 = uVar20;
    local_1290[3] = fVar40;
    for (uVar21 = 0; uVar21 < uVar16 - 1; uVar21 = uVar21 + 2) {
      pGVar6 = (pSVar5->geometries).items[(uint)*pfVar18].ptr;
      (*(pGVar6->super_RefCount)._vptr_RefCount[0x3a])
                (local_1290 + 4,pGVar6,&local_1330,(ulong)(uint)pfVar18[4]);
      local_12f0 = local_1290[4];
      fStack_12ec = local_1290[5];
      fStack_12e8 = local_1290[6];
      fStack_12e4 = fStack_1274;
      local_12e0 = local_1270[0];
      fStack_12dc = local_1270[1];
      fStack_12d8 = local_1270[2];
      fStack_12d4 = local_1270[3];
      auVar25._0_4_ = (int)(((local_1290[4] + local_1270[0]) - fVar22) * fVar32 + -0.5);
      auVar25._4_4_ = (int)(((local_1290[5] + local_1270[1]) - fVar46) * fVar36 + -0.5);
      auVar25._8_4_ = (int)(((local_1290[6] + local_1270[2]) - fVar47) * fVar38 + -0.5);
      auVar25._12_4_ = (int)(((fStack_1274 + local_1270[3]) - fVar48) * fVar40 + -0.5);
      auVar34._4_4_ = uVar17;
      auVar34._0_4_ = uVar17;
      auVar34._8_4_ = uVar17;
      auVar34._12_4_ = uVar17;
      auVar31._0_4_ = -(uint)((int)uVar17 < auVar25._0_4_);
      auVar31._4_4_ = -(uint)((int)uVar17 < auVar25._4_4_);
      auVar31._8_4_ = -(uint)((int)uVar17 < auVar25._8_4_);
      auVar31._12_4_ = -(uint)((int)uVar17 < auVar25._12_4_);
      local_1300 = ~auVar31 & auVar25 | auVar34 & auVar31;
      auVar26._0_4_ = -(uint)(0 < local_1300._0_4_);
      auVar26._4_4_ = -(uint)(0 < local_1300._4_4_);
      auVar26._8_4_ = -(uint)(0 < local_1300._8_4_);
      auVar26._12_4_ = -(uint)(0 < local_1300._12_4_);
      local_1300 = auVar26 & local_1300;
      pGVar6 = (pSVar5->geometries).items[(uint)pfVar18[8]].ptr;
      (*(pGVar6->super_RefCount)._vptr_RefCount[0x3a])
                (local_1290 + 4,pGVar6,&local_1330,(ulong)(uint)pfVar18[0xc]);
      auVar51._4_4_ = local_1290[5];
      auVar51._0_4_ = local_1290[4];
      auVar51._8_4_ = local_1290[6];
      auVar51._12_4_ = fStack_1274;
      auVar8._4_4_ = local_1270[1];
      auVar8._0_4_ = local_1270[0];
      auVar8._8_4_ = local_1270[2];
      auVar8._12_4_ = local_1270[3];
      uVar33 = (uint)(((local_1290[4] + local_1270[0]) - fVar22) * fVar32 + -0.5);
      uVar37 = (uint)(((local_1290[5] + local_1270[1]) - fVar46) * fVar36 + -0.5);
      uVar39 = (uint)(((local_1290[6] + local_1270[2]) - fVar47) * fVar38 + -0.5);
      uVar41 = -(uint)((int)uVar17 < (int)uVar33);
      uVar42 = -(uint)((int)uVar17 < (int)uVar37);
      uVar43 = -(uint)((int)uVar17 < (int)uVar39);
      uVar33 = ~uVar41 & uVar33 | uVar17 & uVar41;
      uVar37 = ~uVar42 & uVar37 | uVar17 & uVar42;
      uVar39 = ~uVar43 & uVar39 | uVar17 & uVar43;
      lVar12 = (ulong)(uint)local_1300._0_4_ * 0x60;
      *(int *)(&local_480 + (ulong)(uint)local_1300._0_4_ * 2) =
           *(int *)(&local_480 + (ulong)(uint)local_1300._0_4_ * 2) + 1;
      auVar44._4_4_ = fStack_12ec;
      auVar44._0_4_ = local_12f0;
      auVar44._8_4_ = fStack_12e8;
      auVar44._12_4_ = fStack_12e4;
      auVar24 = minps(*(undefined1 (*) [16])(local_1080 + lVar12),auVar44);
      *(undefined1 (*) [16])(local_1080 + lVar12) = auVar24;
      auVar49._4_4_ = fStack_12dc;
      auVar49._0_4_ = local_12e0;
      auVar49._8_4_ = fStack_12d8;
      auVar49._12_4_ = fStack_12d4;
      auVar24 = maxps(*(undefined1 (*) [16])(local_1070 + lVar12),auVar49);
      *(undefined1 (*) [16])(local_1070 + lVar12) = auVar24;
      lVar12 = (ulong)(uint)local_1300._4_4_ * 0x60;
      piVar2 = (int *)((long)&local_480 + (ulong)(uint)local_1300._4_4_ * 0x10 + 4);
      *piVar2 = *piVar2 + 1;
      auVar24 = minps(*(undefined1 (*) [16])(local_1060 + lVar12),auVar44);
      *(undefined1 (*) [16])(local_1060 + lVar12) = auVar24;
      auVar24 = maxps(*(undefined1 (*) [16])(local_1050 + lVar12),auVar49);
      *(undefined1 (*) [16])(local_1050 + lVar12) = auVar24;
      lVar12 = (ulong)(uint)local_1300._8_4_ * 0x60;
      aiStack_478[(ulong)(uint)local_1300._8_4_ * 4] =
           aiStack_478[(ulong)(uint)local_1300._8_4_ * 4] + 1;
      auVar24 = minps(*(undefined1 (*) [16])(local_1040 + lVar12),auVar44);
      *(undefined1 (*) [16])(local_1040 + lVar12) = auVar24;
      auVar24 = maxps(*(undefined1 (*) [16])(local_1030 + lVar12),auVar49);
      *(undefined1 (*) [16])(local_1030 + lVar12) = auVar24;
      uVar13 = (ulong)(-(uint)(0 < (int)uVar33) & uVar33);
      lVar12 = uVar13 * 0x60;
      *(int *)(&local_480 + uVar13 * 2) = *(int *)(&local_480 + uVar13 * 2) + 1;
      auVar24 = minps(*(undefined1 (*) [16])(local_1080 + lVar12),auVar51);
      *(undefined1 (*) [16])(local_1080 + lVar12) = auVar24;
      auVar24 = maxps(*(undefined1 (*) [16])(local_1070 + lVar12),auVar8);
      *(undefined1 (*) [16])(local_1070 + lVar12) = auVar24;
      uVar13 = (ulong)(-(uint)(0 < (int)uVar37) & uVar37);
      lVar12 = uVar13 * 0x60;
      piVar2 = (int *)((long)&local_480 + uVar13 * 0x10 + 4);
      *piVar2 = *piVar2 + 1;
      auVar24 = minps(*(undefined1 (*) [16])(local_1060 + lVar12),auVar51);
      *(undefined1 (*) [16])(local_1060 + lVar12) = auVar24;
      auVar24 = maxps(*(undefined1 (*) [16])(local_1050 + lVar12),auVar8);
      *(undefined1 (*) [16])(local_1050 + lVar12) = auVar24;
      uVar13 = (ulong)(-(uint)(0 < (int)uVar39) & uVar39);
      lVar12 = uVar13 * 0x60;
      aiStack_478[uVar13 * 4] = aiStack_478[uVar13 * 4] + 1;
      auVar24 = minps(*(undefined1 (*) [16])(local_1040 + lVar12),auVar51);
      *(undefined1 (*) [16])(local_1040 + lVar12) = auVar24;
      auVar24 = maxps(*(undefined1 (*) [16])(local_1030 + lVar12),auVar8);
      *(undefined1 (*) [16])(local_1030 + lVar12) = auVar24;
      pfVar18 = pfVar18 + 0x10;
    }
    if (uVar21 < uVar16) {
      pGVar6 = (pSVar5->geometries).items[(uint)*pfVar18].ptr;
      (*(pGVar6->super_RefCount)._vptr_RefCount[0x3a])
                (local_1290 + 4,pGVar6,&local_1330,(ulong)(uint)pfVar18[4]);
      auVar7._4_4_ = local_1290[5];
      auVar7._0_4_ = local_1290[4];
      auVar7._8_4_ = local_1290[6];
      auVar7._12_4_ = fStack_1274;
      auVar9._4_4_ = local_1270[1];
      auVar9._0_4_ = local_1270[0];
      auVar9._8_4_ = local_1270[2];
      auVar9._12_4_ = local_1270[3];
      uVar33 = (uint)(((local_1290[4] + local_1270[0]) - fVar22) * fVar32 + -0.5);
      uVar37 = (uint)(((local_1290[5] + local_1270[1]) - fVar46) * fVar36 + -0.5);
      uVar39 = (uint)(((local_1290[6] + local_1270[2]) - fVar47) * fVar38 + -0.5);
      uVar41 = -(uint)((int)uVar17 < (int)uVar33);
      uVar42 = -(uint)((int)uVar17 < (int)uVar37);
      uVar43 = -(uint)((int)uVar17 < (int)uVar39);
      uVar33 = ~uVar41 & uVar33 | uVar17 & uVar41;
      uVar37 = ~uVar42 & uVar37 | uVar17 & uVar42;
      uVar17 = ~uVar43 & uVar39 | uVar17 & uVar43;
      uVar16 = (ulong)(-(uint)(0 < (int)uVar33) & uVar33);
      lVar12 = uVar16 * 0x60;
      *(int *)(&local_480 + uVar16 * 2) = *(int *)(&local_480 + uVar16 * 2) + 1;
      auVar24 = minps(*(undefined1 (*) [16])(local_1080 + lVar12),auVar7);
      *(undefined1 (*) [16])(local_1080 + lVar12) = auVar24;
      auVar24 = maxps(*(undefined1 (*) [16])(local_1070 + lVar12),auVar9);
      *(undefined1 (*) [16])(local_1070 + lVar12) = auVar24;
      uVar16 = (ulong)(-(uint)(0 < (int)uVar37) & uVar37);
      lVar12 = uVar16 * 0x60;
      piVar2 = (int *)((long)&local_480 + uVar16 * 0x10 + 4);
      *piVar2 = *piVar2 + 1;
      auVar24 = minps(*(undefined1 (*) [16])(local_1060 + lVar12),auVar7);
      *(undefined1 (*) [16])(local_1060 + lVar12) = auVar24;
      auVar24 = maxps(*(undefined1 (*) [16])(local_1050 + lVar12),auVar9);
      *(undefined1 (*) [16])(local_1050 + lVar12) = auVar24;
      uVar16 = (ulong)(-(uint)(0 < (int)uVar17) & uVar17);
      lVar12 = uVar16 * 0x60;
      aiStack_478[uVar16 * 4] = aiStack_478[uVar16 * 4] + 1;
      auVar24 = minps(*(undefined1 (*) [16])(local_1040 + lVar12),auVar7);
      *(undefined1 (*) [16])(local_1040 + lVar12) = auVar24;
      auVar24 = maxps(*(undefined1 (*) [16])(local_1030 + lVar12),auVar9);
      *(undefined1 (*) [16])(local_1030 + lVar12) = auVar24;
    }
  }
  pauVar14 = (undefined1 (*) [16])(auStack_1090 + uVar20 * 0x60);
  lVar12 = uVar20 * 0x10;
  iVar23 = 0;
  iVar27 = 0;
  iVar28 = 0;
  iVar29 = 0;
  lVar19 = 0;
  auVar24 = _DAT_01f45a30;
  auVar35 = _DAT_01f45a40;
  auVar34 = _DAT_01f45a30;
  auVar44 = _DAT_01f45a40;
  auVar49 = _DAT_01f45a30;
  auVar51 = _DAT_01f45a40;
  uVar16 = uVar20;
  while (uVar16 = uVar16 - 1, uVar16 != 0) {
    piVar2 = (int *)((long)aiStack_490 + lVar19 + lVar12);
    iVar23 = iVar23 + *piVar2;
    iVar27 = iVar27 + piVar2[1];
    iVar28 = iVar28 + piVar2[2];
    iVar29 = iVar29 + piVar2[3];
    auVar34 = minps(auVar34,pauVar14[-5]);
    auVar44 = maxps(auVar44,pauVar14[-4]);
    auVar24 = minps(auVar24,pauVar14[-3]);
    fVar22 = auVar44._4_4_ - auVar34._4_4_;
    fVar46 = auVar44._8_4_ - auVar34._8_4_;
    auVar35 = maxps(auVar35,pauVar14[-2]);
    fVar47 = auVar35._4_4_ - auVar24._4_4_;
    fVar48 = auVar35._8_4_ - auVar24._8_4_;
    auVar49 = minps(auVar49,pauVar14[-1]);
    auVar51 = maxps(auVar51,*pauVar14);
    *(ulong *)((long)local_1290 + lVar19 + lVar12) =
         CONCAT44((auVar35._0_4_ - auVar24._0_4_) * (fVar47 + fVar48) + fVar48 * fVar47,
                  (auVar44._0_4_ - auVar34._0_4_) * (fVar22 + fVar46) + fVar46 * fVar22);
    fVar22 = auVar51._4_4_ - auVar49._4_4_;
    fVar46 = auVar51._8_4_ - auVar49._8_4_;
    *(float *)((long)local_1290 + lVar19 + lVar12 + 8) =
         (fVar22 + fVar46) * (auVar51._0_4_ - auVar49._0_4_) + fVar46 * fVar22;
    *(undefined4 *)((long)local_1290 + lVar19 + lVar12 + 0xc) = 0;
    piVar2 = (int *)((long)aiStack_290 + lVar19 + lVar12);
    *piVar2 = iVar23;
    piVar2[1] = iVar27;
    piVar2[2] = iVar28;
    piVar2[3] = iVar29;
    pauVar14 = pauVar14 + -6;
    lVar19 = lVar19 + -0x10;
  }
  uVar16 = 0xffffffffffffffff;
  uVar39 = ~(-1 << ((byte)logBlockSize & 0x1f));
  uVar17 = 1;
  uVar33 = 1;
  uVar37 = 1;
  local_12d0[0] = 0;
  local_12d0[1] = 0;
  local_12d0[2] = 0;
  pauVar14 = (undefined1 (*) [16])local_1030;
  lVar12 = 0;
  iVar23 = 0;
  iVar27 = 0;
  iVar28 = 0;
  iVar29 = 0;
  auVar24 = _DAT_01f45a40;
  auVar35 = _DAT_01f45a40;
  local_12c0 = _DAT_01f45a30;
  auVar34 = _DAT_01f45a30;
  auVar44 = _DAT_01f45a30;
  auVar49 = _DAT_01f45a30;
  auVar51 = _DAT_01f45a40;
  for (uVar21 = 1; uVar21 < uVar20; uVar21 = uVar21 + 1) {
    auVar49 = minps(auVar49,pauVar14[-5]);
    auVar51 = maxps(auVar51,pauVar14[-4]);
    auVar44 = minps(auVar44,pauVar14[-3]);
    auVar35 = maxps(auVar35,pauVar14[-2]);
    fVar56 = auVar51._4_4_ - auVar49._4_4_;
    fVar57 = auVar51._8_4_ - auVar49._8_4_;
    auVar34 = minps(auVar34,pauVar14[-1]);
    fVar48 = auVar35._4_4_ - auVar44._4_4_;
    fVar50 = auVar35._8_4_ - auVar44._8_4_;
    auVar24 = maxps(auVar24,*pauVar14);
    fVar22 = auVar24._0_4_ - auVar34._0_4_;
    fVar46 = auVar24._4_4_ - auVar34._4_4_;
    fVar47 = auVar24._8_4_ - auVar34._8_4_;
    iVar23 = iVar23 + *(int *)((long)&local_480 + lVar12);
    iVar27 = iVar27 + *(int *)((long)&local_480 + lVar12 + 4);
    iVar28 = iVar28 + *(int *)((long)aiStack_478 + lVar12);
    iVar29 = iVar29 + *(int *)((long)aiStack_478 + lVar12 + 4);
    uVar13 = logBlockSize & 0xffffffff;
    uVar41 = iVar23 + uVar39 >> uVar13;
    uVar42 = iVar27 + uVar39 >> uVar13;
    uVar43 = iVar28 + uVar39 >> uVar13;
    uVar30 = iVar29 + uVar39 >> uVar13;
    uVar52 = *(int *)((long)aiStack_270 + lVar12) + uVar39 >> uVar13;
    uVar53 = *(int *)((long)aiStack_270 + lVar12 + 4) + uVar39 >> uVar13;
    uVar54 = *(int *)((long)aiStack_270 + lVar12 + 8) + uVar39 >> uVar13;
    uVar55 = *(int *)((long)aiStack_270 + lVar12 + 0xc) + uVar39 >> uVar13;
    auVar45._0_4_ =
         ((float)(uVar52 & 0x7fffffff) + (float)((int)uVar52 >> 0x1f & 0x4f000000)) *
         *(float *)((long)local_1270 + lVar12) +
         ((float)(uVar41 & 0x7fffffff) + (float)((int)uVar41 >> 0x1f & 0x4f000000)) *
         ((auVar51._0_4_ - auVar49._0_4_) * (fVar56 + fVar57) + fVar57 * fVar56);
    auVar45._4_4_ =
         ((float)(uVar53 & 0x7fffffff) + (float)((int)uVar53 >> 0x1f & 0x4f000000)) *
         *(float *)((long)local_1270 + lVar12 + 4) +
         ((float)(uVar42 & 0x7fffffff) + (float)((int)uVar42 >> 0x1f & 0x4f000000)) *
         ((auVar35._0_4_ - auVar44._0_4_) * (fVar48 + fVar50) + fVar50 * fVar48);
    auVar45._8_4_ =
         ((float)(uVar54 & 0x7fffffff) + (float)((int)uVar54 >> 0x1f & 0x4f000000)) *
         *(float *)((long)local_1270 + lVar12 + 8) +
         ((float)(uVar43 & 0x7fffffff) + (float)((int)uVar43 >> 0x1f & 0x4f000000)) *
         (fVar22 * (fVar47 + fVar46) + fVar46 * fVar47);
    auVar45._12_4_ =
         ((float)(uVar55 & 0x7fffffff) + (float)((int)uVar55 >> 0x1f & 0x4f000000)) *
         *(float *)((long)local_1270 + lVar12 + 0xc) +
         ((float)(uVar30 & 0x7fffffff) + (float)((int)uVar30 >> 0x1f & 0x4f000000)) *
         (fVar22 * (fVar46 + fVar47) + fVar47 * fVar46);
    uVar41 = -(uint)(local_12c0._0_4_ <= auVar45._0_4_);
    uVar42 = -(uint)(local_12c0._4_4_ <= auVar45._4_4_);
    uVar43 = -(uint)(local_12c0._8_4_ <= auVar45._8_4_);
    local_12d0[0] = local_12d0[0] & uVar41 | ~uVar41 & uVar17;
    local_12d0[1] = local_12d0[1] & uVar42 | ~uVar42 & uVar33;
    local_12d0[2] = local_12d0[2] & uVar43 | ~uVar43 & uVar37;
    local_12c0 = minps(auVar45,local_12c0);
    uVar17 = uVar17 + 1;
    uVar33 = uVar33 + 1;
    uVar37 = uVar37 + 1;
    lVar12 = lVar12 + 0x10;
    pauVar14 = pauVar14 + 6;
  }
  fVar22 = INFINITY;
  uVar17 = 0;
  for (uVar21 = 0; uVar21 != 3; uVar21 = uVar21 + 1) {
    if ((((local_1290[uVar21] != 0.0) || (NAN(local_1290[uVar21]))) &&
        (*(float *)(local_12c0 + uVar21 * 4) < fVar22)) && (local_12d0[uVar21] != 0)) {
      uVar16 = uVar21 & 0xffffffff;
      uVar17 = local_12d0[uVar21];
      fVar22 = *(float *)(local_12c0 + uVar21 * 4);
    }
  }
  __return_storage_ptr__->sah = fVar22;
  __return_storage_ptr__->dim = (int)uVar16;
  (__return_storage_ptr__->field_2).pos = uVar17;
  __return_storage_ptr__->data = 0;
  (__return_storage_ptr__->mapping).num = uVar20;
  *(undefined8 *)&(__return_storage_ptr__->mapping).ofs.field_0 = uVar10;
  *(undefined8 *)((long)&(__return_storage_ptr__->mapping).ofs.field_0 + 8) = uVar11;
  *(ulong *)&(__return_storage_ptr__->mapping).scale.field_0 = CONCAT44(fVar36,fVar32);
  *(ulong *)((long)&(__return_storage_ptr__->mapping).scale.field_0 + 8) = CONCAT44(fVar40,fVar38);
  return __return_storage_ptr__;
}

Assistant:

const Split find_template(const PrimInfoRange& set, const size_t logBlockSize, const LinearSpace3fa& space)
        {
          Binner binner(empty);
          const BinMapping<BINS> mapping(set);
          BinBoundsAndCenter binBoundsAndCenter(scene,space);
          bin_serial_or_parallel<parallel>(binner,prims,set.begin(),set.end(),size_t(4096),mapping,binBoundsAndCenter);
          return binner.best(mapping,logBlockSize);
        }